

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall
QWidgetRepaintManager::markNeedsFlush(QWidgetRepaintManager *this,QWidget *widget,QRegion *region)

{
  long lVar1;
  long *plVar2;
  long i;
  QWidgetPrivate *pQVar3;
  QRegion *this_00;
  long lVar4;
  long in_FS_OFFSET;
  QWidget *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget != (QWidget *)0x0) {
    pQVar3 = qt_widget_private(widget);
    this_00 = pQVar3->needsFlush;
    if (this_00 == (QRegion *)0x0) {
      this_00 = (QRegion *)operator_new(8);
      QRegion::QRegion(this_00);
      pQVar3->needsFlush = this_00;
    }
    QRegion::operator+=(this_00,region);
    i = *(long *)(this + 0x60);
    if (i != 0) {
      lVar4 = 0;
      do {
        if (i * 8 - lVar4 == 0) goto LAB_0031c382;
        lVar1 = lVar4 + 8;
        plVar2 = (long *)(*(long *)(this + 0x58) + lVar4);
        lVar4 = lVar1;
      } while ((QWidget *)*plVar2 != widget);
      if (lVar1 != 0) goto LAB_0031c39c;
    }
LAB_0031c382:
    local_38 = widget;
    QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
              ((QPodArrayOps<QWidget*> *)(this + 0x50),i,&local_38);
    QList<QWidget_*>::end((QList<QWidget_*> *)(this + 0x50));
  }
LAB_0031c39c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::markNeedsFlush(QWidget *widget, const QRegion &region)
{
    if (!widget)
        return;

    auto *widgetPrivate = qt_widget_private(widget);
    if (!widgetPrivate->needsFlush)
        widgetPrivate->needsFlush = new QRegion;

    *widgetPrivate->needsFlush += region;

    if (!needsFlushWidgets.contains(widget))
        needsFlushWidgets.append(widget);
}